

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O1

void assert_correct_relation_between_relops<mark_negative,ak_toolkit::markable_ns::order_by_value>
               (markable<mark_negative,_ak_toolkit::markable_ns::order_by_value> *a,
               markable<mark_negative,_ak_toolkit::markable_ns::order_by_value> *b)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  iVar1 = a->_storage;
  iVar2 = b->_storage;
  bVar4 = iVar2 < 0;
  if (iVar1 >= 0) {
    bVar4 = iVar1 == iVar2;
  }
  bVar7 = iVar1 < 0;
  if (-1 < iVar2) {
    bVar7 = iVar1 == iVar2;
  }
  if (bVar4 != bVar7) {
    __assert_fail("(a == b) == (b == a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fa,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar3 = -1 < iVar2;
  if (-1 < iVar1) {
    bVar3 = iVar1 != iVar2;
  }
  bVar5 = -1 < iVar1;
  if (-1 < iVar2) {
    bVar5 = iVar1 != iVar2;
  }
  if (bVar3 != bVar5) {
    __assert_fail("(a != b) == (b != a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fb,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if (bVar4 == bVar3) {
    __assert_fail("(a != b) == !(a == b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fc,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if (bVar7 == bVar5) {
    __assert_fail("(b != a) == !(b == a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fd,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if (-1 < iVar2 && (iVar2 <= iVar1 && iVar1 < 0 == -1 < iVar1)) {
    __assert_fail("(a < b) == !(a >= b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x200,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if (-1 < iVar2 && (iVar2 <= iVar1 && iVar1 < 0 == -1 < iVar1)) {
    __assert_fail("(a < b) == !(b <= a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x201,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if (((iVar1 <= iVar2 && iVar2 >= 0 || iVar1 < 0) && (iVar2 <= iVar1 && iVar1 >= 0 || iVar2 < 0))
      != bVar4) {
    __assert_fail("(a == b) == (a >= b && a <= b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x203,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  if ((iVar2 < 0) || (bVar7 = false, -1 < iVar1 && iVar2 <= iVar1)) {
    bVar7 = iVar1 <= iVar2 && -1 < iVar2 || iVar1 < 0;
  }
  if (bVar7 == bVar4) {
    bVar6 = iVar1 <= iVar2 && -1 < iVar2 || iVar1 < 0;
    bVar5 = (bool)(bVar4 ^ bVar6 ^ 1);
    bVar7 = bVar5;
    if (iVar1 < iVar2) {
      bVar7 = bVar6;
    }
    if (iVar1 < 0) {
      bVar7 = bVar6;
    }
    if (iVar2 < 0) {
      bVar7 = bVar5;
    }
    if (bVar7 == false) {
      __assert_fail("(a <= b) == ((a < b) || (a == b))",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x205,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    if ((bool)(bVar4 | ((iVar2 < iVar1 || iVar2 < 0) && iVar1 >= 0)) ==
        ((iVar1 < iVar2 || iVar1 < 0) && iVar2 >= 0)) {
      __assert_fail("(a < b) == (!(a > b) && !(a == b))",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x206,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    if (bVar3 != (-1 < iVar1 && (iVar2 < iVar1 || iVar2 < 0))) {
      if ((iVar2 < 0) || (-1 < iVar1 && iVar2 <= iVar1)) {
        __assert_fail("(a != b) == (a > b) || (b > a)",
                      "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                      ,0x207,
                      "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                     );
      }
    }
    if ((-1 < iVar2) && ((iVar1 < iVar2 || iVar1 < 0) && bVar3 == false)) {
      __assert_fail("a != b",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x209,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    if ((-1 < iVar1) && (bVar3 == false && (iVar2 < iVar1 || iVar2 < 0))) {
      __assert_fail("a != b",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x20a,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    return;
  }
  __assert_fail("(a == b) == (!(a < b) && !(a > b))",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x204,
                "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
               );
}

Assistant:

void assert_correct_relation_between_relops
  (markable<MP, OP> const& a, markable<MP, OP> const& b)
{
  assert( (a == b) ==  (b == a) );
  assert( (a != b) ==  (b != a) );
  assert( (a != b) == !(a == b) );
  assert( (b != a) == !(b == a) );

  assert( (a < b) == (b > a) );
  assert( (a < b) == !(a >= b) );
  assert( (a < b) == !(b <= a) );

  assert( (a == b) == (a >= b && a <= b) );
  assert( (a == b) == (!(a < b) && !(a > b)) );
  assert( (a <= b) == ((a < b) || (a == b)) );
  assert( (a < b) == (!(a > b) && !(a == b)) );
  assert( (a != b) == (a > b) || (b > a) );

  if (a < b) assert(a != b);
  if (a > b) assert(a != b);
}